

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-mongo.c
# Opt level: O3

int op_update(lua_State *L)

{
  uint8_t *__src;
  int iVar1;
  int iVar2;
  int *s;
  int *s_00;
  char *key;
  lua_Integer lVar3;
  uint8_t *__dest;
  size_t __n;
  int iVar4;
  size_t sz;
  luaL_Buffer b;
  buffer local_20e8;
  size_t local_2058;
  luaL_Buffer local_2050;
  
  s = (int *)lua_touserdata(L,3);
  s_00 = (int *)lua_touserdata(L,4);
  if (s_00 != (int *)0x0 && s != (int *)0x0) {
    local_2058 = 0;
    key = luaL_checklstring(L,1,&local_2058);
    luaL_buffinit(L,&local_2050);
    __src = local_20e8.buffer;
    local_20e8.buffer[4] = '\0';
    local_20e8.buffer[5] = '\0';
    local_20e8.buffer[6] = '\0';
    local_20e8.buffer[7] = '\0';
    local_20e8.buffer[8] = '\0';
    local_20e8.buffer[9] = '\0';
    local_20e8.buffer[10] = '\0';
    local_20e8.buffer[0xb] = '\0';
    local_20e8.buffer[0xc] = 0xd1;
    local_20e8.buffer[0xd] = '\a';
    local_20e8.buffer[0xe] = '\0';
    local_20e8.buffer[0xf] = '\0';
    local_20e8.buffer[0x10] = '\0';
    local_20e8.buffer[0x11] = '\0';
    local_20e8.buffer[0x12] = '\0';
    local_20e8.buffer[0x13] = '\0';
    local_20e8.size = 0x14;
    local_20e8.cap = 0x80;
    local_20e8.ptr = __src;
    write_string(&local_20e8,key,local_2058);
    lVar3 = lua_tointegerx(L,2,(int *)0x0);
    iVar4 = local_20e8.size;
    __dest = local_20e8.ptr;
    if (local_20e8.cap < local_20e8.size + 4) {
      __n = (size_t)local_20e8.size;
      do {
        local_20e8.cap = local_20e8.cap * 2;
      } while (local_20e8.cap <= local_20e8.size + 4);
      if (local_20e8.ptr == __src) {
        __dest = (uint8_t *)malloc((long)local_20e8.cap);
        local_20e8.ptr = __dest;
        memcpy(__dest,__src,__n);
      }
      else {
        local_20e8.ptr = (uint8_t *)realloc(local_20e8.ptr,(long)local_20e8.cap);
        __dest = local_20e8.ptr;
        iVar4 = local_20e8.size;
      }
    }
    __dest[iVar4] = (uint8_t)lVar3;
    local_20e8.ptr[iVar4 + 1] = (uint8_t)((ulong)lVar3 >> 8);
    local_20e8.ptr[iVar4 + 2] = (uint8_t)((ulong)lVar3 >> 0x10);
    local_20e8.size = iVar4 + 4;
    local_20e8.ptr[iVar4 + 3] = (uint8_t)((ulong)lVar3 >> 0x18);
    iVar4 = *s;
    iVar1 = *s_00;
    iVar2 = iVar1 + iVar4 + local_20e8.size;
    *local_20e8.ptr = (uint8_t)iVar2;
    local_20e8.ptr[1] = (uint8_t)((uint)iVar2 >> 8);
    local_20e8.ptr[2] = (uint8_t)((uint)iVar2 >> 0x10);
    local_20e8.ptr[3] = (uint8_t)((uint)iVar2 >> 0x18);
    luaL_addlstring(&local_2050,(char *)local_20e8.ptr,(long)local_20e8.size);
    if (local_20e8.ptr != __src) {
      free(local_20e8.ptr);
    }
    luaL_addlstring(&local_2050,(char *)s,(long)iVar4);
    luaL_addlstring(&local_2050,(char *)s_00,(long)iVar1);
    luaL_pushresult(&local_2050);
    return 1;
  }
  luaL_error(L,"Invalid param");
}

Assistant:

static int
op_update(lua_State *L) {
	document selector  = lua_touserdata(L,3);
	document update = lua_touserdata(L,4);
	if (selector == NULL || update == NULL) {
		luaL_error(L, "Invalid param");
	}
	size_t sz = 0;
	const char * name = luaL_checklstring(L,1,&sz);

	luaL_Buffer b;
	luaL_buffinit(L, &b);

	struct buffer buf;
	buffer_create(&buf);
		// make package header, don't raise L error
		int len = reserve_length(&buf);
		write_int32(&buf, 0);
		write_int32(&buf, 0);
		write_int32(&buf, OP_UPDATE);
		write_int32(&buf, 0);
		write_string(&buf, name, sz);
		write_int32(&buf, lua_tointeger(L,2));

		int32_t selector_len = get_length(selector);
		int32_t update_len = get_length(update);

		int total = buf.size + selector_len + update_len;
		write_length(&buf, total, len);

		luaL_addlstring(&b, (const char *)buf.ptr, buf.size);
	buffer_destroy(&buf);

	luaL_addlstring(&b, (const char *)selector, selector_len);
	luaL_addlstring(&b, (const char *)update, update_len);

	luaL_pushresult(&b);

	return 1;
}